

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetCompilePDBDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  string *psVar1;
  allocator<char> local_9;
  
  psVar1 = (string *)GetCompileInfo(this,config);
  if (psVar1 == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_9)
    ;
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetCompilePDBDirectory(
  const std::string& config) const
{
  if (CompileInfo const* info = this->GetCompileInfo(config)) {
    return info->CompilePdbDir;
  }
  return "";
}